

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O0

void threads_end(lzma_stream_coder_conflict1 *coder,lzma_allocator *allocator)

{
  bool bVar1;
  int iVar2;
  uint local_28;
  int ret;
  uint32_t i_1;
  uint mythread_j_453;
  uint mythread_i_453;
  uint32_t i;
  lzma_allocator *allocator_local;
  lzma_stream_coder_conflict1 *coder_local;
  
  for (mythread_j_453 = 0; mythread_j_453 < coder->threads_initialized;
      mythread_j_453 = mythread_j_453 + 1) {
    bVar1 = false;
    while (!bVar1) {
      mythread_mutex_lock(&coder->threads[mythread_j_453].mutex);
      bVar1 = false;
      while (!bVar1) {
        coder->threads[mythread_j_453].state = THR_EXIT;
        mythread_cond_signal(&coder->threads[mythread_j_453].cond);
        bVar1 = true;
      }
      bVar1 = true;
    }
    mythread_mutex_unlock(&coder->threads[mythread_j_453].mutex);
  }
  local_28 = 0;
  while( true ) {
    if (coder->threads_initialized <= local_28) {
      lzma_free(coder->threads,allocator);
      return;
    }
    iVar2 = mythread_join(coder->threads[local_28].thread_id);
    if (iVar2 != 0) break;
    local_28 = local_28 + 1;
  }
  __assert_fail("ret == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                ,0x1cd,"void threads_end(lzma_stream_coder *, const lzma_allocator *)");
}

Assistant:

static void
threads_end(lzma_stream_coder *coder, const lzma_allocator *allocator)
{
	for (uint32_t i = 0; i < coder->threads_initialized; ++i) {
		mythread_sync(coder->threads[i].mutex) {
			coder->threads[i].state = THR_EXIT;
			mythread_cond_signal(&coder->threads[i].cond);
		}
	}

	for (uint32_t i = 0; i < coder->threads_initialized; ++i) {
		int ret = mythread_join(coder->threads[i].thread_id);
		assert(ret == 0);
		(void)ret;
	}

	lzma_free(coder->threads, allocator);
	return;
}